

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O2

void __thiscall Restaurant::goMove(Restaurant *this,string *details)

{
  int src;
  int dst;
  int customerId;
  MoveCustomer *this_00;
  string delimiterSpace;
  MoveCustomer *local_70 [4];
  string token1;
  
  std::__cxx11::string::string((string *)&delimiterSpace," ",(allocator *)&token1);
  token1._M_dataplus._M_p = (pointer)&token1.field_2;
  token1._M_string_length = 0;
  token1.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::find((string *)details,(ulong)&delimiterSpace);
  std::__cxx11::string::substr((ulong)local_70,(ulong)details);
  std::__cxx11::string::operator=((string *)&token1,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  src = std::__cxx11::stoi(&token1,(size_t *)0x0,10);
  std::__cxx11::string::erase((ulong)details,0);
  std::__cxx11::string::find((string *)details,(ulong)&delimiterSpace);
  std::__cxx11::string::substr((ulong)local_70,(ulong)details);
  std::__cxx11::string::operator=((string *)&token1,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  dst = std::__cxx11::stoi(&token1,(size_t *)0x0,10);
  std::__cxx11::string::erase((ulong)details,0);
  std::__cxx11::string::find((string *)details,(ulong)&delimiterSpace);
  std::__cxx11::string::substr((ulong)local_70,(ulong)details);
  std::__cxx11::string::operator=((string *)&token1,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  customerId = std::__cxx11::stoi(&token1,(size_t *)0x0,10);
  std::__cxx11::string::erase((ulong)details,0);
  this_00 = (MoveCustomer *)operator_new(0x38);
  MoveCustomer::MoveCustomer(this_00,src,dst,customerId);
  (**(this_00->super_BaseAction)._vptr_BaseAction)(this_00,this);
  local_70[0] = this_00;
  std::vector<BaseAction*,std::allocator<BaseAction*>>::emplace_back<BaseAction*>
            ((vector<BaseAction*,std::allocator<BaseAction*>> *)&this->actionsLog,
             (BaseAction **)local_70);
  std::__cxx11::string::~string((string *)&token1);
  std::__cxx11::string::~string((string *)&delimiterSpace);
  return;
}

Assistant:

void Restaurant::goMove(std::string details)
{
    int customerId;
    int tableId1;
    int tableId2;
    std::string delimiterSpace = " ";
    size_t pos1 = 0;
    std::string token1;
    pos1 = details.find(delimiterSpace);
    token1 = details.substr(0,pos1);
    customerId = std::stoi(token1);
    details.erase(0, pos1 + delimiterSpace.length());


    pos1 = details.find(delimiterSpace);
    token1 = details.substr(0,pos1);
    tableId1 = std::stoi(token1);
    details.erase(0, pos1 + delimiterSpace.length());

    pos1 = details.find(delimiterSpace);
    token1 = details.substr(0, pos1);
    tableId2 = std::stoi(token1);
    details.erase(0, pos1 + delimiterSpace.length());

    auto * newMove = new MoveCustomer(customerId, tableId1, tableId2);
    newMove->act(*this);
    actionsLog.push_back(newMove);

}